

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,int index,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  layer_destroyer_func in_RCX;
  layer_creator_func in_RDX;
  uint in_ESI;
  long in_RDI;
  void *in_R8;
  custom_layer_registry_entry dummy;
  overwrite_builtin_layer_registry_entry entry;
  size_t i;
  int custom_index;
  value_type *in_stack_ffffffffffffff48;
  vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
  *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
  *in_stack_ffffffffffffff70;
  size_type local_40;
  
  uVar1 = in_ESI & 0xfffffeff;
  if (in_ESI == uVar1) {
    fprintf(_stderr,"overwrite built-in layer type %d",(ulong)in_ESI);
    fprintf(_stderr,"\n");
    local_40 = 0;
    while (sVar4 = local_40,
          sVar2 = std::
                  vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                  ::size((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                          *)(*(long *)(in_RDI + 0x48) + 0xb0)), sVar4 < sVar2) {
      pvVar3 = std::
               vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
               ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                             *)(*(long *)(in_RDI + 0x48) + 0xb0),local_40);
      if (pvVar3->typeindex == in_ESI) {
        fprintf(_stderr,"overwrite existing overwritten built-in layer index %d",(ulong)in_ESI);
        fprintf(_stderr,"\n");
        pvVar3 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0xb0),local_40);
        pvVar3->creator = in_RDX;
        pvVar3 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0xb0),local_40);
        pvVar3->destroyer = in_RCX;
        pvVar3 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0xb0),local_40);
        pvVar3->userdata = in_R8;
        return 0;
      }
      local_40 = local_40 + 1;
    }
    std::
    vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
    ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    sVar4 = std::
            vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
            ::size((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                    *)(*(long *)(in_RDI + 0x48) + 0x98));
    if ((int)sVar4 <= (int)uVar1) {
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    pvVar5 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar1);
    if (pvVar5->creator != (layer_creator_func)0x0) {
      fprintf(_stderr,"overwrite existing custom layer index %d",(ulong)uVar1);
      fprintf(_stderr,"\n");
    }
    pvVar5 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar1);
    pvVar5->creator = in_RDX;
    pvVar5 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar1);
    pvVar5->destroyer = in_RCX;
    pvVar5 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar1);
    pvVar5->userdata = in_R8;
  }
  return 0;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        NCNN_LOGE("overwrite built-in layer type %d", index);

        for (size_t i = 0; i < d->overwrite_builtin_layer_registry.size(); i++)
        {
            if (d->overwrite_builtin_layer_registry[i].typeindex == index)
            {
                NCNN_LOGE("overwrite existing overwritten built-in layer index %d", index);

                d->overwrite_builtin_layer_registry[i].creator = creator;
                d->overwrite_builtin_layer_registry[i].destroyer = destroyer;
                d->overwrite_builtin_layer_registry[i].userdata = userdata;
                return 0;
            }
        }

        struct overwrite_builtin_layer_registry_entry entry = {index, creator, destroyer, userdata};
        d->overwrite_builtin_layer_registry.push_back(entry);
        return 0;
    }

    if ((int)d->custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct custom_layer_registry_entry dummy = {"", 0, 0, 0};
#else
        struct custom_layer_registry_entry dummy = {0, 0, 0};
#endif // NCNN_STRING
        d->custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (d->custom_layer_registry[custom_index].creator)
    {
        NCNN_LOGE("overwrite existing custom layer index %d", custom_index);
    }

    d->custom_layer_registry[custom_index].creator = creator;
    d->custom_layer_registry[custom_index].destroyer = destroyer;
    d->custom_layer_registry[custom_index].userdata = userdata;
    return 0;
}